

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O2

void __thiscall
OpenMPDirective::generateDOT
          (OpenMPDirective *this,ofstream *dot_file,int depth,int index,string *parent_node,
          string *trait_score)

{
  OpenMPDirectiveKind OVar1;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *pvVar2;
  OpenMPClause *pOVar3;
  bool bVar4;
  ostream *poVar5;
  pointer ppOVar6;
  SourceLocation *pSVar7;
  ulong uVar8;
  pointer ppOVar9;
  int local_2c4;
  string tkind_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string node_id;
  string expr_name;
  string list_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string expr_name_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string tkind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  uint local_178;
  allocator<char> local_171;
  string current_line;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string directive_id;
  string directive_kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  directive_kind._M_dataplus._M_p = (pointer)&directive_kind.field_2;
  directive_kind._M_string_length = 0;
  directive_kind.field_2._M_local_buf[0] = '\0';
  OVar1 = this->kind;
  local_178 = depth;
  switch(OVar1) {
  case OMPD_for_simd:
    goto LAB_001502fc;
  default:
    toString_abi_cxx11_(&indent,this);
    toString_abi_cxx11_(&directive_id,this);
    std::__cxx11::string::substr((ulong)&current_line,(ulong)&indent);
    std::__cxx11::string::operator=((string *)&directive_kind,(string *)&current_line);
    std::__cxx11::string::~string((string *)&current_line);
    std::__cxx11::string::~string((string *)&directive_id);
    std::__cxx11::string::~string((string *)&indent);
    goto LAB_0015033a;
  case OMPD_distribute_simd:
    goto LAB_001502fc;
  case OMPD_distribute_parallel_for:
    goto LAB_001502fc;
  case OMPD_distribute_parallel_do:
    goto LAB_001502fc;
  case OMPD_distribute_parallel_for_simd:
    goto LAB_001502fc;
  case OMPD_distribute_parallel_do_simd:
    goto LAB_001502fc;
  case OMPD_cancellation_point:
    goto LAB_001502fc;
  case OMPD_declare_reduction:
    goto LAB_001502fc;
  case OMPD_declare_mapper:
    goto LAB_001502fc;
  case OMPD_taskloop_simd:
    goto LAB_001502fc;
  case OMPD_target_data:
    goto LAB_001502fc;
  case OMPD_target_enter_data:
    goto LAB_001502fc;
  case OMPD_target_update:
    goto LAB_001502fc;
  case OMPD_target_exit_data:
    goto LAB_001502fc;
  case OMPD_declare_target:
    goto LAB_001502fc;
  case OMPD_end_declare_target:
    goto LAB_001502fc;
  case OMPD_depobj:
LAB_001502fc:
    std::__cxx11::string::assign((char *)&directive_kind);
    goto LAB_0015033a;
  case OMPD_teams_distribute:
    break;
  case OMPD_teams_distribute_simd:
    break;
  case OMPD_teams_distribute_parallel_for:
    break;
  case OMPD_teams_distribute_parallel_for_simd:
    break;
  case OMPD_teams_loop:
    break;
  case OMPD_target_parallel:
    break;
  case OMPD_target_parallel_for:
    break;
  case OMPD_target_parallel_for_simd:
    break;
  case OMPD_target_parallel_loop:
    break;
  case OMPD_target_simd:
    break;
  case OMPD_target_teams:
    break;
  case OMPD_target_teams_distribute:
    break;
  case OMPD_target_teams_distribute_simd:
    break;
  case OMPD_target_teams_loop:
    break;
  case OMPD_target_teams_distribute_parallel_for:
    break;
  case OMPD_target_teams_distribute_parallel_for_simd:
    break;
  case OMPD_teams_distribute_parallel_do:
    break;
  case OMPD_teams_distribute_parallel_do_simd:
    break;
  case OMPD_target_parallel_do:
    break;
  case OMPD_target_parallel_do_simd:
    break;
  case OMPD_target_teams_distribute_parallel_do:
    break;
  case OMPD_target_teams_distribute_parallel_do_simd:
  }
  std::__cxx11::string::append((char *)&directive_kind);
LAB_0015033a:
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)local_178);
  std::operator+(&tkind,parent_node,"_");
  std::operator+(&expr_name,&tkind,&directive_kind);
  std::operator+(&list_name,&expr_name,"_");
  std::__cxx11::to_string(&expr_name_2,index);
  std::operator+(&directive_id,&list_name,&expr_name_2);
  std::__cxx11::string::~string((string *)&expr_name_2);
  std::__cxx11::string::~string((string *)&list_name);
  std::__cxx11::string::~string((string *)&expr_name);
  std::__cxx11::string::~string((string *)&tkind);
  std::operator+(&expr_name_2,&indent,parent_node);
  std::operator+(&tkind,&expr_name_2," -- ");
  std::operator+(&expr_name,&tkind,&directive_id);
  std::operator+(&list_name,&expr_name,"\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&list_name);
  std::__cxx11::string::~string((string *)&list_name);
  std::__cxx11::string::~string((string *)&expr_name);
  std::__cxx11::string::~string((string *)&tkind);
  std::__cxx11::string::~string((string *)&expr_name_2);
  std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&indent);
  poVar5 = std::operator<<((ostream *)dot_file,(string *)&indent);
  poVar5 = std::operator<<(poVar5,directive_id._M_dataplus._M_p);
  std::operator+(&expr_name," [label = \"",&directive_kind);
  std::operator+(&list_name,&expr_name,"\"]\n");
  std::operator<<(poVar5,(string *)&list_name);
  std::__cxx11::string::~string((string *)&list_name);
  std::__cxx11::string::~string((string *)&expr_name);
  bVar4 = std::operator!=(trait_score,"");
  if (bVar4) {
    std::operator+(&tkind_2,&indent,&directive_id);
    std::operator+(&expr_name_2,&tkind_2," -- ");
    std::operator+(&tkind,&expr_name_2,&directive_id);
    std::operator+(&expr_name,&tkind,"_score");
    std::operator+(&list_name,&expr_name,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&list_name);
    std::__cxx11::string::~string((string *)&list_name);
    std::__cxx11::string::~string((string *)&expr_name);
    std::__cxx11::string::~string((string *)&tkind);
    std::__cxx11::string::~string((string *)&expr_name_2);
    std::__cxx11::string::~string((string *)&tkind_2);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&node_id,&indent,"\t");
    std::operator+(&tkind_2,&node_id,&directive_id);
    std::operator+(&expr_name_2,&tkind_2,"_score");
    std::operator+(&tkind,&expr_name_2," [label = \"score\\n ");
    std::operator+(&expr_name,&tkind,trait_score);
    std::operator+(&list_name,&expr_name,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&list_name);
    std::__cxx11::string::~string((string *)&list_name);
    std::__cxx11::string::~string((string *)&expr_name);
    std::__cxx11::string::~string((string *)&tkind);
    std::__cxx11::string::~string((string *)&expr_name_2);
    std::__cxx11::string::~string((string *)&tkind_2);
    std::__cxx11::string::~string((string *)&node_id);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  }
  if (OVar1 == OMPD_declare_reduction) {
    std::__cxx11::string::string((string *)&list_name,(string *)&this[1].clauses_in_original_order);
    std::__cxx11::string::string
              ((string *)&expr_name,
               (string *)&this[1].clauses._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
    tkind._M_dataplus._M_p = (pointer)&tkind.field_2;
    tkind._M_string_length = 0;
    tkind.field_2._M_local_buf[0] = '\0';
    expr_name_2._M_dataplus._M_p = (pointer)&expr_name_2.field_2;
    expr_name_2._M_string_length = 0;
    expr_name_2.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tkind_2,"declare_reduction",(allocator<char> *)&node_id);
    std::operator+(&node_id,&tkind_2,"_reduction_identifier");
    std::operator+(&local_198,&indent,&tkind_2);
    std::operator+(&local_1d8,&local_198," -- ");
    std::operator+(&local_298,&local_1d8,&node_id);
    std::operator+(&local_218,&local_298,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_198);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_f0,&indent,"\t");
    std::operator+(&local_110,&local_f0,&node_id);
    std::operator+(&local_130,&local_110," [label = \"");
    std::operator+(&local_198,&local_130,&node_id);
    std::operator+(&local_1d8,&local_198,"\\n ");
    std::operator+(&local_298,&local_1d8,&list_name);
    std::operator+(&local_218,&local_298,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_298,&tkind_2,"_typename_list_");
    std::__cxx11::to_string(&local_1d8,0);
    std::operator+(&local_218,&local_298,&local_1d8);
    std::__cxx11::string::operator=((string *)&tkind,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_298);
    std::operator+(&local_198,&indent,&tkind_2);
    std::operator+(&local_1d8,&local_198," -- ");
    std::operator+(&local_298,&local_1d8,&tkind);
    std::operator+(&local_218,&local_298,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_198);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    pSVar7 = *(SourceLocation **)&this[1].super_SourceLocation;
    local_2c4 = 0;
    for (; pSVar7 != this[1].super_SourceLocation.parent_construct;
        pSVar7 = (SourceLocation *)&pSVar7->parent_construct) {
      std::operator+(&local_298,&tkind,"_expr");
      std::__cxx11::to_string(&local_1d8,local_2c4);
      std::operator+(&local_218,&local_298,&local_1d8);
      std::__cxx11::string::operator=((string *)&expr_name_2,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_298);
      std::operator+(&local_130,&indent,&indent);
      std::operator+(&local_198,&local_130,&tkind);
      std::operator+(&local_1d8,&local_198," -- ");
      std::operator+(&local_298,&local_1d8,&expr_name_2);
      std::operator+(&local_218,&local_298,"\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_130);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::operator+(&local_70,&indent,&indent);
      std::operator+(&local_f0,&local_70,"\t");
      std::operator+(&local_110,&local_f0,&expr_name_2);
      std::operator+(&local_130,&local_110," [label = \"");
      std::operator+(&local_198,&local_130,&expr_name_2);
      std::operator+(&local_1d8,&local_198,"\\n ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,*(char **)pSVar7,&local_171);
      std::operator+(&local_298,&local_1d8,&local_90);
      std::operator+(&local_218,&local_298,"\"]\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      local_2c4 = local_2c4 + 1;
    }
    std::operator+(&local_218,&tkind_2,"_combiner");
    std::__cxx11::string::operator=((string *)&node_id,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::operator+(&local_198,&indent,&tkind_2);
    std::operator+(&local_1d8,&local_198," -- ");
    std::operator+(&local_298,&local_1d8,&node_id);
    std::operator+(&local_218,&local_298,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_198);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_f0,&indent,"\t");
    std::operator+(&local_110,&local_f0,&node_id);
    std::operator+(&local_130,&local_110," [label = \"");
    std::operator+(&local_198,&local_130,&node_id);
    std::operator+(&local_1d8,&local_198,"\\n ");
    std::operator+(&local_298,&local_1d8,&expr_name);
    std::operator+(&local_218,&local_298,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&node_id);
    std::__cxx11::string::~string((string *)&tkind_2);
    std::__cxx11::string::~string((string *)&expr_name_2);
    std::__cxx11::string::~string((string *)&tkind);
    std::__cxx11::string::~string((string *)&expr_name);
    std::__cxx11::string::~string((string *)&list_name);
  }
  else {
    if (OVar1 == OMPD_threadprivate) {
      list_name._M_string_length = 0;
      list_name.field_2._M_local_buf[0] = '\0';
      expr_name._M_dataplus._M_p = (pointer)&expr_name.field_2;
      expr_name._M_string_length = 0;
      expr_name.field_2._M_local_buf[0] = '\0';
      list_name._M_dataplus._M_p = (pointer)&list_name.field_2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tkind,"threadprivate",(allocator<char> *)&expr_name_2);
      std::operator+(&tkind_2,&tkind,"_directive_list_");
      std::__cxx11::to_string(&node_id,0);
      std::operator+(&expr_name_2,&tkind_2,&node_id);
      std::__cxx11::string::operator=((string *)&list_name,(string *)&expr_name_2);
      std::__cxx11::string::~string((string *)&expr_name_2);
      std::__cxx11::string::~string((string *)&node_id);
      std::__cxx11::string::~string((string *)&tkind_2);
      std::operator+(&local_218,&indent,&tkind);
      std::operator+(&node_id,&local_218," -- ");
      std::operator+(&tkind_2,&node_id,&list_name);
      std::operator+(&expr_name_2,&tkind_2,"\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name_2);
      std::__cxx11::string::~string((string *)&expr_name_2);
      std::__cxx11::string::~string((string *)&tkind_2);
      std::__cxx11::string::~string((string *)&node_id);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      pSVar7 = *(SourceLocation **)&this[1].super_SourceLocation;
      local_2c4 = 0;
      for (; pSVar7 != this[1].super_SourceLocation.parent_construct;
          pSVar7 = (SourceLocation *)&pSVar7->parent_construct) {
        std::operator+(&tkind_2,&list_name,"_expr");
        std::__cxx11::to_string(&node_id,local_2c4);
        std::operator+(&expr_name_2,&tkind_2,&node_id);
        std::__cxx11::string::operator=((string *)&expr_name,(string *)&expr_name_2);
        std::__cxx11::string::~string((string *)&expr_name_2);
        std::__cxx11::string::~string((string *)&node_id);
        std::__cxx11::string::~string((string *)&tkind_2);
        std::operator+(&local_298,&indent,&indent);
        std::operator+(&local_218,&local_298,&list_name);
        std::operator+(&node_id,&local_218," -- ");
        std::operator+(&tkind_2,&node_id,&expr_name);
        std::operator+(&expr_name_2,&tkind_2,"\n");
        std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name_2);
        std::__cxx11::string::~string((string *)&expr_name_2);
        std::__cxx11::string::~string((string *)&tkind_2);
        std::__cxx11::string::~string((string *)&node_id);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_298);
        std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
        std::operator+(&local_130,&indent,&indent);
        std::operator+(&local_198,&local_130,"\t");
        std::operator+(&local_1d8,&local_198,&expr_name);
        std::operator+(&local_298,&local_1d8," [label = \"");
        std::operator+(&local_218,&local_298,&expr_name);
        std::operator+(&node_id,&local_218,"\\n ");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,*(char **)pSVar7,(allocator<char> *)&local_f0);
        std::operator+(&tkind_2,&node_id,&local_110);
        std::operator+(&expr_name_2,&tkind_2,"\"]\n");
        std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name_2);
        std::__cxx11::string::~string((string *)&expr_name_2);
        std::__cxx11::string::~string((string *)&tkind_2);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&node_id);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_130);
        std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
        local_2c4 = local_2c4 + 1;
      }
    }
    else {
      if (OVar1 != OMPD_allocate) goto LAB_00151908;
      list_name._M_string_length = 0;
      list_name.field_2._M_local_buf[0] = '\0';
      expr_name._M_dataplus._M_p = (pointer)&expr_name.field_2;
      expr_name._M_string_length = 0;
      expr_name.field_2._M_local_buf[0] = '\0';
      list_name._M_dataplus._M_p = (pointer)&list_name.field_2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tkind,"allocate",(allocator<char> *)&expr_name_2);
      std::operator+(&tkind_2,&tkind,"_directive_list_");
      std::__cxx11::to_string(&node_id,0);
      std::operator+(&expr_name_2,&tkind_2,&node_id);
      std::__cxx11::string::operator=((string *)&list_name,(string *)&expr_name_2);
      std::__cxx11::string::~string((string *)&expr_name_2);
      std::__cxx11::string::~string((string *)&node_id);
      std::__cxx11::string::~string((string *)&tkind_2);
      std::operator+(&local_218,&indent,&tkind);
      std::operator+(&node_id,&local_218," -- ");
      std::operator+(&tkind_2,&node_id,&list_name);
      std::operator+(&expr_name_2,&tkind_2,"\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name_2);
      std::__cxx11::string::~string((string *)&expr_name_2);
      std::__cxx11::string::~string((string *)&tkind_2);
      std::__cxx11::string::~string((string *)&node_id);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      pSVar7 = *(SourceLocation **)&this[1].super_SourceLocation;
      local_2c4 = 0;
      for (; pSVar7 != this[1].super_SourceLocation.parent_construct;
          pSVar7 = (SourceLocation *)&pSVar7->parent_construct) {
        std::operator+(&tkind_2,&list_name,"_expr");
        std::__cxx11::to_string(&node_id,local_2c4);
        std::operator+(&expr_name_2,&tkind_2,&node_id);
        std::__cxx11::string::operator=((string *)&expr_name,(string *)&expr_name_2);
        std::__cxx11::string::~string((string *)&expr_name_2);
        std::__cxx11::string::~string((string *)&node_id);
        std::__cxx11::string::~string((string *)&tkind_2);
        std::operator+(&local_298,&indent,&indent);
        std::operator+(&local_218,&local_298,&list_name);
        std::operator+(&node_id,&local_218," -- ");
        std::operator+(&tkind_2,&node_id,&expr_name);
        std::operator+(&expr_name_2,&tkind_2,"\n");
        std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name_2);
        std::__cxx11::string::~string((string *)&expr_name_2);
        std::__cxx11::string::~string((string *)&tkind_2);
        std::__cxx11::string::~string((string *)&node_id);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_298);
        std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
        std::operator+(&local_130,&indent,&indent);
        std::operator+(&local_198,&local_130,"\t");
        std::operator+(&local_1d8,&local_198,&expr_name);
        std::operator+(&local_298,&local_1d8," [label = \"");
        std::operator+(&local_218,&local_298,&expr_name);
        std::operator+(&node_id,&local_218,"\\n ");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,*(char **)pSVar7,(allocator<char> *)&local_f0);
        std::operator+(&tkind_2,&node_id,&local_110);
        std::operator+(&expr_name_2,&tkind_2,"\"]\n");
        std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name_2);
        std::__cxx11::string::~string((string *)&expr_name_2);
        std::__cxx11::string::~string((string *)&tkind_2);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&node_id);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_130);
        std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
        local_2c4 = local_2c4 + 1;
      }
    }
    std::__cxx11::string::~string((string *)&tkind);
    std::__cxx11::string::~string((string *)&expr_name);
    std::__cxx11::string::~string((string *)&list_name);
  }
LAB_00151908:
  pvVar2 = this->clauses_in_original_order;
  ppOVar9 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppOVar6 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppOVar6 != ppOVar9) {
    local_178 = local_178 + 1;
    uVar8 = 0;
    for (; ppOVar9 != ppOVar6; ppOVar9 = ppOVar9 + 1) {
      pOVar3 = *ppOVar9;
      std::__cxx11::string::string(local_50,(string *)&directive_id);
      (*pOVar3->_vptr_OpenMPClause[1])(pOVar3,dot_file,(ulong)local_178,uVar8,local_50);
      std::__cxx11::string::~string(local_50);
      uVar8 = (ulong)((int)uVar8 + 1);
      ppOVar6 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  std::__cxx11::string::~string((string *)&directive_id);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&current_line);
  std::__cxx11::string::~string((string *)&directive_kind);
  return;
}

Assistant:

void OpenMPDirective::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node, std::string trait_score) {

    std::string directive_kind;
    OpenMPDirectiveKind kind = this->getKind();
    switch(kind) {
        case OMPD_cancellation_point :
            directive_kind = "cancellation_point";
            break;
        case OMPD_for_simd:
            directive_kind = "for_simd";
            break;
        case OMPD_distribute_simd:
            directive_kind = "distribute_simd";
            break;
        case OMPD_distribute_parallel_for:
            directive_kind = "distribute_parallel_for";
            break; 
       case OMPD_distribute_parallel_do:
            directive_kind = "distribute_parallel_do";
            break;
        case OMPD_distribute_parallel_for_simd:
            directive_kind = "distribute_parallel_for_simd";
            break;
        case OMPD_distribute_parallel_do_simd:
            directive_kind = "distribute_parallel_do_simd";
            break;
        case OMPD_declare_reduction:
            directive_kind = "declare_reduction";
            break;
        case OMPD_declare_mapper:
            directive_kind = "declare_mapper";
            break;
        case OMPD_taskloop_simd:
            directive_kind = "taskloop_simd";
            break;
        case OMPD_target_data:
            directive_kind = "target_data";
            break;
        case OMPD_target_enter_data:
            directive_kind = "target_enter_data";
            break;
        case OMPD_target_exit_data:
            directive_kind = "target_exit_data";
            break;
        case OMPD_target_update:
            directive_kind = "target_update";
            break;
        case OMPD_declare_target:
            directive_kind = "declare_target";
            break;
        case OMPD_end_declare_target:
            directive_kind = "end_declare_target";
            break;
        case OMPD_depobj:
            directive_kind = "depobj ";
            break;
        case OMPD_teams_distribute:
            directive_kind += "teams_distribute ";
            break;
        case OMPD_teams_distribute_simd:
            directive_kind += "teams_distribute_simd ";
            break;
        case OMPD_teams_distribute_parallel_for:
            directive_kind += "teams_distribute_parallel_for ";
            break;
        case OMPD_teams_distribute_parallel_for_simd:
            directive_kind += "teams_distribute_parallel_for_simd ";
            break;
        case OMPD_teams_loop:
            directive_kind += "teams_loop ";
            break;
        case OMPD_target_parallel:
            directive_kind += "target_parallel ";
            break;
        case OMPD_target_parallel_for:
            directive_kind += "target_parallel_for ";
            break;
        case OMPD_target_parallel_for_simd:
            directive_kind += "target_parallel_for_simd ";
            break;
        case OMPD_target_parallel_loop:
            directive_kind += "target_parallel_loop ";
            break;
        case OMPD_target_simd:
            directive_kind += "target_simd ";
            break;
        case OMPD_target_teams:
            directive_kind += "target_teams ";
            break;
        case OMPD_target_teams_distribute:
            directive_kind += "target_teams_distribute ";
            break;
        case OMPD_target_teams_distribute_simd:
            directive_kind += "target_teams_distribute_simd ";
            break;
        case OMPD_target_teams_loop:
            directive_kind += "target_teams_loop ";
            break;
        case OMPD_target_teams_distribute_parallel_for:
            directive_kind += "target_teams_distribute_parallel_for ";
            break;
        case OMPD_target_teams_distribute_parallel_for_simd:
            directive_kind += "target_teams_distribute_parallel_for_simd ";
            break;
        case OMPD_teams_distribute_parallel_do:
            directive_kind += "teams distribute parallel do ";
            break;
        case OMPD_teams_distribute_parallel_do_simd:
            directive_kind += "teams distribute parallel do simd ";
            break;
        case OMPD_target_parallel_do:
            directive_kind += "target parallel do ";
            break;
        case OMPD_target_parallel_do_simd:
            directive_kind += "target parallel do simd ";
            break;
        case OMPD_target_teams_distribute_parallel_do:
            directive_kind += "target teams distribute parallel do ";
            break;
        case OMPD_target_teams_distribute_parallel_do_simd:
            directive_kind += "target teams distribute parallel do simd ";
            break;
        default:
            directive_kind = this->toString().substr(0, this->toString().size()-1);
    }
    std::string current_line;
    std::string indent = std::string(depth, '\t');
    std::string directive_id = parent_node + "_" + directive_kind + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + directive_id + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    dot_file << indent << directive_id.c_str() << " [label = \"" + directive_kind + "\"]\n";

    // output score
    if (trait_score != "") {
        current_line = indent + directive_id + " -- " + directive_id + "_score" + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + directive_id + "_score" + " [label = \"score\\n " + trait_score + "\"]\n";
        dot_file << current_line.c_str();
    }; 

    switch (kind) {
        case OMPD_allocate: {
            std::vector<const char *> *list = ((OpenMPAllocateDirective *) this)->getAllocateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "allocate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            dot_file << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                dot_file << current_line.c_str();
                current_line =
                        indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                        "\"]\n";
                dot_file << current_line.c_str();
            }
            break;
        }
        case OMPD_threadprivate: {
            std::vector<const char *> *list = ((OpenMPThreadprivateDirective*)this)->getThreadprivateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "threadprivate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            dot_file << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                dot_file << current_line.c_str();
                current_line =
                        indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                        "\"]\n";
                dot_file << current_line.c_str();
            }
            break;
        }
        case OMPD_declare_reduction: {
            std::vector<const char*>* list = ((OpenMPDeclareReductionDirective*)this)->getTypenameList();
            std::vector<const char*>::iterator list_item;
            std::string id = ((OpenMPDeclareReductionDirective*)this)->getIdentifier();
            std::string combiner = ((OpenMPDeclareReductionDirective*)this)->getCombiner();
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "declare_reduction";
            std::string node_id = tkind + "_reduction_identifier";
            current_line = indent + tkind + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + id + "\"]\n";
            dot_file << current_line.c_str();
            list_name = tkind + "_typename_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            dot_file << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                dot_file << current_line.c_str();
                current_line =
                        indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                        "\"]\n";
                dot_file << current_line.c_str();
            }
            node_id = tkind + "_combiner";
            current_line = indent + tkind + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + combiner + "\"]\n";
            dot_file << current_line.c_str();
            break;
        }
        default: {
            ;
        }
    };

    std::vector<OpenMPClause*>* clauses = this->getClausesInOriginalOrder();
    if (clauses->size() != 0) {
        std::vector<OpenMPClause*>::iterator iter;
        int clause_index = 0;
        for (iter = clauses->begin(); iter != clauses->end(); iter++) {
            (*iter)->generateDOT(dot_file, depth+1, clause_index, directive_id);
            clause_index += 1;
        };
    };

}